

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::MemoryStressCase::iterate(MemoryStressCase *this)

{
  ostringstream *poVar1;
  MemObjectType objectTypes;
  int iVar2;
  TestLog *log;
  RenderContext *renderContext;
  int *piVar3;
  bool bVar4;
  deUint32 seed;
  GLenum GVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  IterateResult IVar11;
  IterateResult testResult;
  qpTestResult testResult_00;
  int iVar12;
  float fVar13;
  MemObjectAllocator allocator;
  undefined1 local_1b0 [384];
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  renderContext = this->m_renderCtx;
  objectTypes = this->m_objectTypes;
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  MemObjectAllocator::MemObjectAllocator
            (&allocator,log,renderContext,objectTypes,&this->m_config,seed);
  bVar4 = MemObjectAllocator::allocUntilFailure(&allocator);
  if (!bVar4) {
    MemObjectAllocator::clearObjects(&allocator);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Timeout. Couldn\'t exhaust memory in timelimit. Allocated ");
    std::ostream::operator<<(poVar1,allocator.m_objectCount);
    std::operator<<((ostream *)poVar1," objects.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    IVar11 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    goto LAB_014c66c3;
  }
  if (this->m_clearAfterOOM == true) {
    glwClear(0x4500);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x36c);
  }
  MemObjectAllocator::clearObjects(&allocator);
  local_1b0._0_4_ = allocator.m_objectCount;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_allocated,(int *)local_1b0);
  if ((this->m_iteration != 0) && (allocator.m_objectCount == 0)) {
    this->m_zeroAlloc = true;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Got error when allocation object count: ");
  std::ostream::operator<<(poVar1,allocator.m_objectCount);
  std::operator<<((ostream *)poVar1," bytes: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (allocator.m_glError == 0x505) {
    IVar11 = STOP;
  }
  else {
    IVar11 = CONTINUE;
    if ((allocator.m_glError == 0) && (allocator.m_result == RESULT_GOT_BAD_ALLOC)) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"std::bad_alloc");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pcVar6 = "Memory allocation failed";
      testResult = 6;
    }
    else {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Invalid Error ");
      pcVar6 = MemObjectAllocator::resultToString(allocator.m_result);
      std::operator<<((ostream *)poVar1,pcVar6);
      std::operator<<((ostream *)poVar1," GLError: ");
      switch(allocator.m_glError) {
      case 0x500:
        pcVar6 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar6 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar6 = "GL_INVALID_OPERATION";
        break;
      case 0x503:
      case 0x504:
switchD_014c63b1_caseD_503:
        pcVar6 = (char *)0x0;
        break;
      case 0x505:
        pcVar6 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        break;
      default:
        if (allocator.m_glError != 0) goto switchD_014c63b1_caseD_503;
        pcVar6 = "<none>";
      }
      std::operator<<((ostream *)poVar1,pcVar6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pcVar6 = "Fail";
      testResult = IVar11;
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,testResult,pcVar6);
  }
  if (this->m_iteration + 1 == this->m_iterationCount) {
    piVar3 = (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *piVar3;
    uVar7 = (ulong)((long)(this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
    uVar9 = 0;
    iVar10 = iVar12;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar2 = piVar3[uVar9];
      if (iVar2 < iVar10) {
        iVar10 = iVar2;
      }
      if (iVar12 < iVar2) {
        iVar12 = iVar2;
      }
    }
    if (iVar10 == 0 && iVar12 != 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Allocation count zero");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      IVar11 = CONTINUE;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    }
    else {
      fVar13 = (float)(iVar10 - iVar12) / (float)iVar12;
      if (fVar13 <= 50.0) {
        pcVar6 = "Pass";
        testResult_00 = QP_TEST_RESULT_PASS;
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Allocated objects max: ");
        std::ostream::operator<<(poVar1,iVar12);
        std::operator<<((ostream *)poVar1,", min: ");
        std::ostream::operator<<(poVar1,iVar10);
        std::operator<<((ostream *)poVar1,", difference: ");
        std::ostream::operator<<(poVar1,fVar13);
        std::operator<<((ostream *)poVar1,"% threshold: ");
        std::ostream::operator<<(poVar1,50.0);
        std::operator<<((ostream *)poVar1,"%");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pcVar6 = "Allocation count variation";
        testResult_00 = QP_TEST_RESULT_QUALITY_WARNING;
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,testResult_00,pcVar6);
      IVar11 = CONTINUE;
    }
  }
  glwFinish();
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x3a7);
  this->m_iteration = this->m_iteration + 1;
  IVar11 = IVar11 ^ CONTINUE;
LAB_014c66c3:
  MemObjectAllocator::~MemObjectAllocator(&allocator);
  return IVar11;
}

Assistant:

tcu::TestCase::IterateResult MemoryStressCase::iterate (void)
{
	bool			end		= false;
	tcu::TestLog&	log		= m_testCtx.getLog();

	MemObjectAllocator allocator(log, m_renderCtx, m_objectTypes, m_config, deStringHash(getName()));

	if (!allocator.allocUntilFailure())
	{
		// Allocation timed out
		allocator.clearObjects();

		log << TestLog::Message << "Timeout. Couldn't exhaust memory in timelimit. Allocated " << allocator.getObjectCount() << " objects." << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	// Try to cancel rendering operations
	if (m_clearAfterOOM)
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

	allocator.clearObjects();

	m_allocated.push_back(allocator.getObjectCount());

	if (m_iteration != 0  && allocator.getObjectCount() == 0)
		m_zeroAlloc = true;

	log << TestLog::Message << "Got error when allocation object count: " << allocator.getObjectCount() << " bytes: " << allocator.getBytes() << TestLog::EndMessage;

	if ((allocator.getGLError() == 0) && (allocator.getResult() == MemObjectAllocator::RESULT_GOT_BAD_ALLOC))
	{
		log << TestLog::Message << "std::bad_alloc" << TestLog::EndMessage;
		end = true;
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Memory allocation failed");
	}
	else if (allocator.getGLError() != GL_OUT_OF_MEMORY)
	{
		log << TestLog::Message << "Invalid Error " << MemObjectAllocator::resultToString(allocator.getResult())
			<< " GLError: " << glErrorToString(allocator.getGLError()) <<
		TestLog::EndMessage;

		end = true;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	if ((m_iteration+1) == m_iterationCount)
	{
		int min = m_allocated[0];
		int max = m_allocated[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocated.size(); allocNdx++)
		{
			min = deMin32(m_allocated[allocNdx], min);
			max = deMax32(m_allocated[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			const float change = (float)(min - max) / (float)(max);
			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		end = true;
	}

	GLU_CHECK_CALL(glFinish());

	m_iteration++;
	if (end)
		return STOP;
	else
		return CONTINUE;
}